

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_constants.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::MoveConstantsRule::Apply
          (MoveConstantsRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  bool bVar2;
  ExpressionType EVar3;
  reference pvVar4;
  BoundComparisonExpression *pBVar5;
  BoundConstantExpression *pBVar6;
  BoundFunctionExpression *pBVar7;
  BoundConstantExpression *pBVar8;
  hugeint_t *lhs;
  hugeint_t *lhs_00;
  reference pvVar9;
  bool *pbVar10;
  undefined1 *puVar11;
  string *__lhs;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var12;
  undefined7 in_register_00000081;
  hugeint_t hVar13;
  hugeint_t value;
  hugeint_t rhs;
  hugeint_t value_00;
  hugeint_t rhs_00;
  hugeint_t value_01;
  hugeint_t value_02;
  hugeint_t outer_value;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_260;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_258;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_250;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_248;
  Value *local_240;
  ulong local_238;
  LogicalType *local_230;
  undefined1 *local_228;
  hugeint_t inner_value;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_210;
  Value result_value;
  LogicalType local_1b8;
  Value local_1a0;
  Value local_160;
  hugeint_t local_120;
  hugeint_t local_110;
  hugeint_t local_100;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  local_228 = (undefined1 *)CONCAT71(in_register_00000081,is_root);
  pbVar10 = changes_made;
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar5 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                     (&pvVar4->_M_data->super_BaseExpression);
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  pBVar6 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar4->_M_data->super_BaseExpression);
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  pBVar7 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&pvVar4->_M_data->super_BaseExpression);
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,3);
  pBVar8 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar4->_M_data->super_BaseExpression);
  if ((((LogicalType *)&(pBVar8->value).is_null)->id_ != '\0') ||
     (((LogicalType *)&(pBVar6->value).is_null)->id_ == '\x01')) {
    EVar3 = (pBVar5->super_Expression).super_BaseExpression.type;
    if ((EVar3 != COMPARE_BOUNDARY_END) && (EVar3 != COMPARE_DISTINCT_FROM)) {
      LogicalType::LogicalType(&local_1b8,&(pBVar5->super_Expression).return_type);
      Value::Value(&result_value,&local_1b8);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&outer_value,&result_value)
      ;
      (this->super_Rule)._vptr_Rule = (_func_int **)outer_value.lower;
      outer_value.lower = 0;
      Value::~Value(&result_value);
      LogicalType::~LogicalType(&local_1b8);
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
    }
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  local_240 = &pBVar6->value;
  local_230 = &(pBVar6->super_Expression).return_type;
  outer_value = IntegralValue::Get(local_240);
  rhs_00.lower = outer_value.upper;
  lhs = (hugeint_t *)outer_value.lower;
  inner_value = IntegralValue::Get(&pBVar8->value);
  hVar13.lower = inner_value.upper;
  lhs_00 = (hugeint_t *)inner_value.lower;
  this_00 = &pBVar7->children;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(this_00,0);
  _Var1._M_head_impl =
       (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  local_238 = (ulong)((BoundConstantExpression *)_Var1._M_head_impl == pBVar8);
  __lhs = &(pBVar7->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  bVar2 = ::std::operator==(__lhs,"+");
  if (bVar2) {
    hVar13.upper = (int64_t)pbVar10;
    bVar2 = Hugeint::TrySubtractInPlace((Hugeint *)&outer_value,lhs_00,hVar13);
    if (!bVar2) goto LAB_0058dd31;
    value.upper = (int64_t)pbVar10;
    value.lower = outer_value.upper;
    Value::HUGEINT(&result_value,(Value *)outer_value.lower,value);
    bVar2 = Value::DefaultTryCastAs(&result_value,local_230,false);
    puVar11 = local_228;
    if (!bVar2) {
      if ((pBVar5->super_Expression).super_BaseExpression.type != COMPARE_BOUNDARY_START)
      goto LAB_0058dcd7;
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_00,local_238);
      local_248._M_head_impl =
           (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      Value::BOOLEAN(&local_70,false);
      ExpressionRewriter::ConstantOrNull
                ((ExpressionRewriter *)this,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_248,&local_70);
      Value::~Value(&local_70);
      if (local_248._M_head_impl != (Expression *)0x0) {
        (*((local_248._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_248._M_head_impl = (Expression *)0x0;
      goto LAB_0058dcdb;
    }
LAB_0058dc59:
    puVar11 = local_228;
    Value::operator=(local_240,&result_value);
  }
  else {
    bVar2 = ::std::operator==(__lhs,"-");
    if (!bVar2) {
      hugeint_t::hugeint_t((hugeint_t *)&result_value,0);
      bVar2 = hugeint_t::operator==(&inner_value,(hugeint_t *)&result_value);
      if (bVar2) goto LAB_0058dd31;
      result_value.type_.id_ = INVALID;
      result_value.type_.physical_type_ = ~INVALID;
      result_value.type_._2_6_ = 0;
      result_value.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x8000000000000000;
      bVar2 = hugeint_t::operator==(&outer_value,(hugeint_t *)&result_value);
      if (bVar2) {
        hugeint_t::hugeint_t(&local_100,-1);
        bVar2 = hugeint_t::operator==(&inner_value,&local_100);
        if (!bVar2) goto LAB_0058db25;
      }
      else {
LAB_0058db25:
        local_110 = hugeint_t::operator%(&outer_value,&inner_value);
        hugeint_t::hugeint_t(&local_120,0);
        bVar2 = hugeint_t::operator!=(&local_110,&local_120);
        if (!bVar2) {
          hugeint_t::hugeint_t((hugeint_t *)&result_value,0);
          bVar2 = hugeint_t::operator<(&inner_value,(hugeint_t *)&result_value);
          if (bVar2) {
            EVar3 = FlipComparisonExpression((pBVar5->super_Expression).super_BaseExpression.type);
            (pBVar5->super_Expression).super_BaseExpression.type = EVar3;
          }
          hVar13 = hugeint_t::operator/(&outer_value,&inner_value);
          value_02.lower = hVar13.upper;
          value_02.upper = (int64_t)pbVar10;
          Value::HUGEINT(&result_value,(Value *)hVar13.lower,value_02);
          bVar2 = Value::DefaultTryCastAs(&result_value,local_230,false);
          puVar11 = local_228;
          if (bVar2) goto LAB_0058dc59;
          pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::get<true>(this_00,local_238);
          local_260._M_head_impl =
               (pvVar9->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          Value::BOOLEAN(&local_1a0,false);
          ExpressionRewriter::ConstantOrNull
                    ((ExpressionRewriter *)this,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_260,&local_1a0);
          Value::~Value(&local_1a0);
          if (local_260._M_head_impl != (Expression *)0x0) {
            (*((local_260._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_260._M_head_impl = (Expression *)0x0;
          goto LAB_0058dcdb;
        }
      }
      EVar3 = (pBVar5->super_Expression).super_BaseExpression.type;
      if ((byte)(EVar3 - COMPARE_BOUNDARY_START) < 2) {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(this_00,local_238);
        local_210._M_head_impl =
             (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        Value::BOOLEAN(&local_160,EVar3 == COMPARE_NOTEQUAL);
        ExpressionRewriter::ConstantOrNull
                  ((ExpressionRewriter *)this,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_210,&local_160);
        Value::~Value(&local_160);
        if (local_210._M_head_impl == (Expression *)0x0) {
          return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this
          ;
        }
        (*((local_210._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
      }
      goto LAB_0058dd31;
    }
    if ((BoundConstantExpression *)_Var1._M_head_impl == pBVar8) {
      rhs_00.upper = (int64_t)pbVar10;
      bVar2 = Hugeint::TrySubtractInPlace((Hugeint *)&inner_value,lhs,rhs_00);
      if (!bVar2) goto LAB_0058dd31;
      value_01.upper = (int64_t)pbVar10;
      value_01.lower = inner_value.upper;
      Value::HUGEINT(&result_value,(Value *)inner_value.lower,value_01);
      bVar2 = Value::DefaultTryCastAs(&result_value,local_230,false);
      puVar11 = local_228;
      if (bVar2) {
        Value::operator=(local_240,&result_value);
        EVar3 = FlipComparisonExpression((pBVar5->super_Expression).super_BaseExpression.type);
        (pBVar5->super_Expression).super_BaseExpression.type = EVar3;
      }
      else {
        if ((pBVar5->super_Expression).super_BaseExpression.type != COMPARE_BOUNDARY_START)
        goto LAB_0058dcd7;
        pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(this_00,1);
        local_258._M_head_impl =
             (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        Value::BOOLEAN(&local_f0,false);
        ExpressionRewriter::ConstantOrNull
                  ((ExpressionRewriter *)this,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_258,&local_f0);
        Value::~Value(&local_f0);
        if (local_258._M_head_impl != (Expression *)0x0) {
          (*((local_258._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_258._M_head_impl = (Expression *)0x0;
      }
    }
    else {
      rhs.upper = (int64_t)pbVar10;
      rhs.lower = hVar13.lower;
      bVar2 = Hugeint::TryAddInPlace((Hugeint *)&outer_value,lhs_00,rhs);
      if (!bVar2) goto LAB_0058dd31;
      value_00.upper = (int64_t)pbVar10;
      value_00.lower = outer_value.upper;
      Value::HUGEINT(&result_value,(Value *)outer_value.lower,value_00);
      bVar2 = Value::DefaultTryCastAs(&result_value,local_230,false);
      puVar11 = local_228;
      if (bVar2) goto LAB_0058dc59;
      if ((pBVar5->super_Expression).super_BaseExpression.type == COMPARE_BOUNDARY_START) {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(this_00,0);
        local_250._M_head_impl =
             (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        Value::BOOLEAN(&local_b0,false);
        ExpressionRewriter::ConstantOrNull
                  ((ExpressionRewriter *)this,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_250,&local_b0);
        Value::~Value(&local_b0);
        if (local_250._M_head_impl != (Expression *)0x0) {
          (*((local_250._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_250._M_head_impl = (Expression *)0x0;
      }
      else {
LAB_0058dcd7:
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
        puVar11 = local_228;
      }
    }
  }
LAB_0058dcdb:
  Value::~Value(&result_value);
  if (bVar2 == false) {
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  pvVar9 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(this_00,local_238);
  _Var1._M_head_impl =
       (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  _Var12._M_head_impl =
       (pBVar5->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if ((BoundConstantExpression *)_Var12._M_head_impl == pBVar6) {
    _Var12._M_head_impl =
         (pBVar5->right).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar5->right).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var1._M_head_impl;
  }
  else {
    (pBVar5->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var1._M_head_impl;
  }
  if (_Var12._M_head_impl != (Expression *)0x0) {
    (**(code **)((long)((_Var12._M_head_impl)->super_BaseExpression)._vptr_BaseExpression + 8))();
  }
  *puVar11 = 1;
LAB_0058dd31:
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> MoveConstantsRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                bool &changes_made, bool is_root) {
	auto &comparison = bindings[0].get().Cast<BoundComparisonExpression>();
	auto &outer_constant = bindings[1].get().Cast<BoundConstantExpression>();
	auto &arithmetic = bindings[2].get().Cast<BoundFunctionExpression>();
	auto &inner_constant = bindings[3].get().Cast<BoundConstantExpression>();
	D_ASSERT(arithmetic.return_type.IsIntegral());
	D_ASSERT(arithmetic.children[0]->return_type.IsIntegral());
	if (inner_constant.value.IsNull() || outer_constant.value.IsNull()) {
		if (comparison.GetExpressionType() == ExpressionType::COMPARE_DISTINCT_FROM ||
		    comparison.GetExpressionType() == ExpressionType::COMPARE_NOT_DISTINCT_FROM) {
			return nullptr;
		}
		return make_uniq<BoundConstantExpression>(Value(comparison.return_type));
	}
	auto &constant_type = outer_constant.return_type;
	hugeint_t outer_value = IntegralValue::Get(outer_constant.value);
	hugeint_t inner_value = IntegralValue::Get(inner_constant.value);

	idx_t arithmetic_child_index = arithmetic.children[0].get() == &inner_constant ? 1 : 0;
	auto &op_type = arithmetic.function.name;
	if (op_type == "+") {
		// [x + 1 COMP 10] OR [1 + x COMP 10]
		// order does not matter in addition:
		// simply change right side to 10-1 (outer_constant - inner_constant)
		if (!Hugeint::TrySubtractInPlace(outer_value, inner_value)) {
			return nullptr;
		}
		auto result_value = Value::HUGEINT(outer_value);
		if (!result_value.DefaultTryCastAs(constant_type)) {
			if (comparison.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
				return nullptr;
			}
			// if the cast is not possible then the comparison is not possible
			// for example, if we have x + 5 = 3, where x is an unsigned number, we will get x = -2
			// since this is not possible we can remove the entire branch here
			return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
			                                          Value::BOOLEAN(false));
		}
		outer_constant.value = std::move(result_value);
	} else if (op_type == "-") {
		// [x - 1 COMP 10] O R [1 - x COMP 10]
		// order matters in subtraction:
		if (arithmetic_child_index == 0) {
			// [x - 1 COMP 10]
			// change right side to 10+1 (outer_constant + inner_constant)
			if (!Hugeint::TryAddInPlace(outer_value, inner_value)) {
				return nullptr;
			}
			auto result_value = Value::HUGEINT(outer_value);
			if (!result_value.DefaultTryCastAs(constant_type)) {
				// if the cast is not possible then an equality comparison is not possible
				if (comparison.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
					return nullptr;
				}
				return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
				                                          Value::BOOLEAN(false));
			}
			outer_constant.value = std::move(result_value);
		} else {
			// [1 - x COMP 10]
			// change right side to 1-10=-9
			if (!Hugeint::TrySubtractInPlace(inner_value, outer_value)) {
				return nullptr;
			}
			auto result_value = Value::HUGEINT(inner_value);
			if (!result_value.DefaultTryCastAs(constant_type)) {
				// if the cast is not possible then an equality comparison is not possible
				if (comparison.GetExpressionType() != ExpressionType::COMPARE_EQUAL) {
					return nullptr;
				}
				return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
				                                          Value::BOOLEAN(false));
			}
			outer_constant.value = std::move(result_value);
			// in this case, we should also flip the comparison
			// e.g. if we have [4 - x < 2] then we should have [x > 2]
			comparison.SetExpressionTypeUnsafe(FlipComparisonExpression(comparison.GetExpressionType()));
		}
	} else {
		D_ASSERT(op_type == "*");
		// [x * 2 COMP 10] OR [2 * x COMP 10]
		// order does not matter in multiplication:
		// change right side to 10/2 (outer_constant / inner_constant)
		// but ONLY if outer_constant is cleanly divisible by the inner_constant
		if (inner_value == 0) {
			// x * 0, the result is either 0 or NULL
			// we let the arithmetic_simplification rule take care of simplifying this first
			return nullptr;
		}
		// check out of range for HUGEINT or not cleanly divisible
		// HUGEINT is not cleanly divisible when outer_value == minimum and inner value == -1. (modulo overflow)
		if ((outer_value == NumericLimits<hugeint_t>::Minimum() && inner_value == -1) ||
		    outer_value % inner_value != 0) {
			bool is_equality = comparison.GetExpressionType() == ExpressionType::COMPARE_EQUAL;
			bool is_inequality = comparison.GetExpressionType() == ExpressionType::COMPARE_NOTEQUAL;
			if (is_equality || is_inequality) {
				// we know the values are not equal
				// the result will be either FALSE or NULL (if COMPARE_EQUAL)
				// or TRUE or NULL (if COMPARE_NOTEQUAL)
				return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
				                                          Value::BOOLEAN(is_inequality));
			} else {
				// not cleanly divisible and we are doing > >= < <=, skip the simplification for now
				return nullptr;
			}
		}
		if (inner_value < 0) {
			// multiply by negative value, need to flip expression
			comparison.SetExpressionTypeUnsafe(FlipComparisonExpression(comparison.GetExpressionType()));
		}
		// else divide the RHS by the LHS
		// we need to do a range check on the cast even though we do a division
		// because e.g. -128 / -1 = 128, which is out of range
		auto result_value = Value::HUGEINT(outer_value / inner_value);
		if (!result_value.DefaultTryCastAs(constant_type)) {
			return ExpressionRewriter::ConstantOrNull(std::move(arithmetic.children[arithmetic_child_index]),
			                                          Value::BOOLEAN(false));
		}
		outer_constant.value = std::move(result_value);
	}
	// replace left side with x
	// first extract x from the arithmetic expression
	auto arithmetic_child = std::move(arithmetic.children[arithmetic_child_index]);
	// then place in the comparison
	if (comparison.left.get() == &outer_constant) {
		comparison.right = std::move(arithmetic_child);
	} else {
		comparison.left = std::move(arithmetic_child);
	}
	changes_made = true;
	return nullptr;
}